

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O1

ssize_t __thiscall
libtorrent::aux::posix_storage::write(posix_storage *this,int __fd,void *__buf,size_t __n)

{
  pointer psVar1;
  bool bVar2;
  char cVar3;
  open_mode_t mode;
  file_index_t fVar4;
  int iVar5;
  int64_t iVar6;
  ulong uVar7;
  ssize_t sVar8;
  int *piVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  size_t sVar13;
  file_storage *pfVar14;
  int in_R8D;
  int in_R9D;
  file_storage *this_00;
  generic_error_category *pgVar15;
  void *__buf_00;
  int iVar16;
  long lVar17;
  undefined1 uVar18;
  peer_request pVar19;
  int *in_stack_00000008;
  error_code e;
  uint local_7c;
  storage_error *local_78;
  uint local_6c;
  undefined4 local_58;
  char cStack_54;
  system_error_category *psStack_50;
  _Alloc_hider local_48;
  void *local_40;
  undefined8 local_38;
  
  this_00 = (this->m_mapped_files)._M_t.
            super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
            .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (this_00 == (file_storage *)0x0) {
    this_00 = this->m_files;
  }
  lVar17 = (long)in_R9D + (long)this_00->m_piece_length * (long)in_R8D;
  local_40 = __buf;
  mode.m_val = (uint)file_storage::file_index_at_offset(this_00,lVar17);
  iVar6 = file_storage::file_offset(this_00,(file_index_t)mode.m_val);
  local_78 = (storage_error *)(lVar17 - iVar6);
  local_38 = &this->m_stat_cache;
  local_7c = 0;
  do {
    if ((long)__n < 1) {
      local_6c = local_7c;
      break;
    }
    iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
    sVar13 = __n;
    if (iVar6 < (long)&(local_78->ec).val_ + (long)(int)__n) {
      iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
      uVar11 = (int)iVar6 - (int)local_78;
      sVar13 = (size_t)uVar11;
      if ((int)uVar11 < 1) {
        sVar13 = 0;
      }
    }
    iVar12 = (int)sVar13;
    if (iVar12 == 0) {
      do {
        mode.m_val = mode.m_val + 1;
        fVar4 = file_storage::end_file(this_00);
        if (fVar4.m_val <= (int)mode.m_val) {
          bVar2 = false;
          local_78 = (storage_error *)0x0;
          local_6c = local_7c;
          goto LAB_0029f81c;
        }
        iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
      } while (iVar6 == 0);
      iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
      sVar13 = __n;
      if (iVar6 < (int)__n) {
        uVar7 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
        sVar13 = uVar7 & 0xffffffff;
        if ((int)uVar7 < 1) {
          sVar13 = 0;
        }
      }
      iVar12 = (int)sVar13;
      local_78 = (storage_error *)0x0;
    }
    pfVar14 = (this->m_mapped_files)._M_t.
              super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
              .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
    if (pfVar14 == (file_storage *)0x0) {
      pfVar14 = this->m_files;
    }
    bVar2 = file_storage::pad_file_at(pfVar14,(file_index_t)mode.m_val);
    iVar16 = iVar12;
    if (!bVar2) {
      __buf_00 = (void *)(long)iVar12;
      psVar1 = (this->m_file_priority).
               super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               .
               super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((int)mode.m_val <
            *(int *)&(this->m_file_priority).
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     .
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) &&
          (psVar1[(int)mode.m_val].m_val == '\0')) &&
         (bVar2 = use_partfile(this,(file_index_t)mode.m_val), bVar2)) {
        local_58 = 0;
        _cStack_54 = _cStack_54 & 0xffffff00;
        psStack_50 = &boost::system::detail::cat_holder<void>::system_category_instance;
        pfVar14 = (this->m_mapped_files)._M_t.
                  super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                  .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
        if (pfVar14 == (file_storage *)0x0) {
          pfVar14 = this->m_files;
        }
        pVar19 = file_storage::map_file(pfVar14,(file_index_t)mode.m_val,(int64_t)local_78,0);
        sVar8 = posix_part_file::write
                          ((this->m_part_file)._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
                           .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>.
                           _M_head_impl,(int)local_40,__buf_00,(ulong)(uint)pVar19.piece.m_val.m_val
                          );
        iVar16 = (int)sVar8;
        if (cStack_54 == '\x01') {
          *(ulong *)in_stack_00000008 = CONCAT44(_cStack_54,local_58);
          *(system_error_category **)(in_stack_00000008 + 2) = psStack_50;
          *(undefined1 *)((long)in_stack_00000008 + 0x13) = 0x25;
        }
      }
      else {
        open_file((posix_storage *)&stack0xffffffffffffffa8,(file_index_t)(int)this,mode,1,local_78)
        ;
        iVar16 = -1;
        if ((char)in_stack_00000008[1] == '\0') {
          *(undefined1 *)((long)in_stack_00000008 + 0x13) = 7;
          local_48._M_p = (pointer)CONCAT44(_cStack_54,local_58);
          sVar13 = fwrite(local_40,1,(size_t)__buf_00,(FILE *)local_48._M_p);
          iVar16 = (int)sVar13;
          if ((void *)(long)iVar16 != __buf_00) {
            iVar5 = ferror((FILE *)local_48._M_p);
            if (iVar5 == 0) {
              pgVar15 = (generic_error_category *)libtorrent_category();
              *in_stack_00000008 = 0x17;
              uVar18 = 1;
              if ((((error_category *)pgVar15)->id_ != 0x8fafd21e25c5e09b) &&
                 (((error_category *)pgVar15)->id_ != 0xb2ab117a257edf0d)) {
                iVar5 = (*((error_category *)pgVar15)->_vptr_error_category[6])(pgVar15,0x17);
                uVar18 = (undefined1)iVar5;
              }
            }
            else {
              piVar9 = __errno_location();
              iVar5 = *piVar9;
              *in_stack_00000008 = iVar5;
              uVar18 = iVar5 != 0;
              pgVar15 = &boost::system::detail::cat_holder<void>::generic_category_instance;
            }
            *(undefined1 *)(in_stack_00000008 + 1) = uVar18;
            *(generic_error_category **)(in_stack_00000008 + 2) = pgVar15;
          }
          stat_cache::set_dirty((stat_cache *)local_38,(file_index_t)mode.m_val);
        }
        if ((FILE *)CONCAT44(_cStack_54,local_58) != (FILE *)0x0) {
          fclose((FILE *)CONCAT44(_cStack_54,local_58));
        }
      }
    }
    bVar2 = *in_stack_00000008 == 0;
    if (bVar2) {
      lVar17 = (long)iVar16;
      local_40 = (void *)((long)local_40 + lVar17);
      __n = __n - lVar17;
      local_78 = (storage_error *)((long)&(local_78->ec).val_ + lVar17);
      local_7c = local_7c + iVar16;
      if ((0 < iVar12) && (iVar16 == 0)) {
        *(undefined1 *)((long)in_stack_00000008 + 0x13) = 8;
        uVar10 = 0x100000002;
        if ((DAT_004fcee8 != -0x70502de1da3a1f65) &&
           (uVar10 = 0x100000002, DAT_004fcee8 != -0x4d54ee85da8120f3)) {
          cVar3 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                            (&boost::asio::error::get_misc_category()::instance,2);
          uVar10 = 2;
          if (cVar3 != '\0') {
            uVar10 = 0x100000002;
          }
        }
        *(undefined8 *)in_stack_00000008 = uVar10;
        *(pointer_____offset_0x10___ **)(in_stack_00000008 + 2) =
             &boost::asio::error::get_misc_category()::instance;
        goto LAB_0029f80e;
      }
      bVar2 = true;
    }
    else {
      local_6c = local_7c;
LAB_0029f80e:
      *(short *)(in_stack_00000008 + 4) = (short)mode.m_val;
      *(char *)((long)in_stack_00000008 + 0x12) = (char)(mode.m_val >> 0x10);
    }
LAB_0029f81c:
  } while (bVar2);
  return (ulong)local_6c;
}

Assistant:

int posix_storage::write(settings_interface const&
		, span<char const> buffer
		, piece_index_t const piece, int const offset
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_WRITE
		std::this_thread::sleep_for(milliseconds(rand() % 800));
#endif
		return readwrite(files(), buffer, piece, offset, error
			, [this](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
			{
				// writing to a pad-file is a no-op
				return int(buf.size());
			}

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				TORRENT_ASSERT(m_part_file);

				error_code e;
				peer_request map = files().map_file(file_index
					, file_offset, 0);
				int const ret = m_part_file->write(buf, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_write;
				}
				return ret;
			}

			file_pointer const f = open_file(file_index, open_mode::write
				, file_offset, ec);
			if (ec.ec) return -1;

			// set this unconditionally in case the upper layer would like to treat
			// short reads as errors
			ec.operation = operation_t::file_write;

			int ret = 0;
			auto const r = static_cast<int>(std::fwrite(buf.data(), 1
				, static_cast<std::size_t>(buf.size()), f.file()));
			if (r != buf.size())
			{
				if (std::ferror(f.file())) ec.ec.assign(errno, generic_category());
				else ec.ec.assign(errors::file_too_short, libtorrent_category());
			}
			ret += r;

			// invalidate our stat cache for this file, since
			// we're writing to it
			m_stat_cache.set_dirty(file_index);
			return ret;
		});
	}